

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetFwd.c
# Opt level: O3

Aig_Man_t * Saig_ManRetimeForwardOne(Aig_Man_t *p,int *pnRegFixed,int *pnRegMoves)

{
  int iVar1;
  Vec_Ptr_t *vCut;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Man_t *pAVar4;
  long lVar5;
  int iVar6;
  void *pvVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  void *pvVar12;
  
  Saig_ManMarkAutonomous(p);
  Aig_ManIncrementTravId(p);
  *pnRegFixed = 0;
  iVar1 = p->nRegs;
  if (0 < iVar1) {
    pVVar3 = p->vCis;
    iVar6 = 0;
    do {
      uVar8 = p->nTruePis + iVar6;
      if (((int)uVar8 < 0) || (pVVar3->nSize <= (int)uVar8)) goto LAB_006f1384;
      pvVar12 = pVVar3->pArray[uVar8];
      if (p->nTravIds + -1 == *(int *)((long)pvVar12 + 0x20)) {
        *(int *)((long)pvVar12 + 0x20) = p->nTravIds;
      }
      else {
        *pnRegFixed = *pnRegFixed + 1;
        iVar1 = p->nRegs;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < iVar1);
  }
  *pnRegMoves = 0;
  pVVar3 = p->vObjs;
  iVar1 = pVVar3->nSize;
  if (0 < iVar1) {
    ppvVar2 = pVVar3->pArray;
    lVar9 = 0;
    do {
      pvVar12 = ppvVar2[lVar9];
      if ((((pvVar12 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar12 + 0x18) & 7) - 7)) &&
          (iVar6 = p->nTravIds,
          *(int *)((*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffe) + 0x20) == iVar6)) &&
         (*(int *)((*(ulong *)((long)pvVar12 + 0x10) & 0xfffffffffffffffe) + 0x20) == iVar6)) {
        *(int *)((long)pvVar12 + 0x20) = iVar6;
        *pnRegMoves = *pnRegMoves + 1;
        iVar1 = pVVar3->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar1);
  }
  lVar9 = (long)p->nRegs;
  if (0 < lVar9) {
    pVVar3 = p->vCis;
    uVar8 = p->nTruePis;
    uVar10 = (ulong)uVar8;
    do {
      if (((int)uVar8 < 0) || (pVVar3->nSize <= (int)uVar10)) {
LAB_006f1384:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      *(int *)((long)pVVar3->pArray[uVar10] + 0x20) = p->nTravIds;
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  vCut = (Vec_Ptr_t *)malloc(0x10);
  vCut->nCap = 1000;
  vCut->nSize = 0;
  ppvVar2 = (void **)malloc(8000);
  vCut->pArray = ppvVar2;
  Aig_ManIncrementTravId(p);
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    iVar1 = 0;
    uVar11 = 1000;
    uVar10 = 1000;
    lVar9 = 0;
    do {
      pvVar12 = pVVar3->pArray[lVar9];
      if (pvVar12 != (void *)0x0) {
        iVar6 = p->nTravIds;
        if (iVar6 + -1 != *(int *)((long)pvVar12 + 0x20)) {
          pvVar7 = (void *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffe);
          if ((pvVar7 != (void *)0x0) && (iVar6 + -1 == *(int *)((long)pvVar7 + 0x20))) {
            iVar6 = (int)uVar10;
            if (iVar1 == iVar6) {
              if (iVar6 < 0x10) {
                if (vCut->pArray == (void **)0x0) {
                  ppvVar2 = (void **)malloc(0x80);
                }
                else {
                  ppvVar2 = (void **)realloc(vCut->pArray,0x80);
                }
                vCut->pArray = ppvVar2;
                vCut->nCap = 0x10;
                uVar11 = 0x10;
                uVar10 = 0x10;
              }
              else {
                uVar11 = (ulong)(uint)(iVar6 * 2);
                if (vCut->pArray == (void **)0x0) {
                  ppvVar2 = (void **)malloc(uVar11 * 8);
                }
                else {
                  ppvVar2 = (void **)realloc(vCut->pArray,uVar11 * 8);
                }
                vCut->pArray = ppvVar2;
                vCut->nCap = iVar6 * 2;
                uVar10 = uVar11;
              }
            }
            else {
              ppvVar2 = vCut->pArray;
            }
            lVar5 = (long)iVar1;
            iVar1 = iVar1 + 1;
            vCut->nSize = iVar1;
            ppvVar2[lVar5] = pvVar7;
            iVar6 = p->nTravIds;
            *(int *)((long)pvVar7 + 0x20) = iVar6;
          }
          pvVar12 = (void *)(*(ulong *)((long)pvVar12 + 0x10) & 0xfffffffffffffffe);
          if ((pvVar12 != (void *)0x0) && (iVar6 + -1 == *(int *)((long)pvVar12 + 0x20))) {
            iVar6 = (int)uVar11;
            if (iVar1 == iVar6) {
              if (iVar6 < 0x10) {
                if (vCut->pArray == (void **)0x0) {
                  ppvVar2 = (void **)malloc(0x80);
                }
                else {
                  ppvVar2 = (void **)realloc(vCut->pArray,0x80);
                }
                vCut->pArray = ppvVar2;
                vCut->nCap = 0x10;
                uVar11 = 0x10;
              }
              else {
                uVar11 = (ulong)(uint)(iVar6 * 2);
                if (vCut->pArray == (void **)0x0) {
                  ppvVar2 = (void **)malloc(uVar11 * 8);
                }
                else {
                  ppvVar2 = (void **)realloc(vCut->pArray,uVar11 * 8);
                }
                vCut->pArray = ppvVar2;
                vCut->nCap = iVar6 * 2;
              }
            }
            else {
              ppvVar2 = vCut->pArray;
            }
            lVar5 = (long)iVar1;
            iVar1 = iVar1 + 1;
            vCut->nSize = iVar1;
            ppvVar2[lVar5] = pvVar12;
            *(int *)((long)pvVar12 + 0x20) = p->nTravIds;
            uVar10 = uVar11;
          }
        }
      }
      lVar9 = lVar9 + 1;
      pVVar3 = p->vObjs;
    } while (lVar9 < pVVar3->nSize);
  }
  pAVar4 = Saig_ManRetimeDupForward(p,vCut);
  if (vCut->pArray != (void **)0x0) {
    free(vCut->pArray);
  }
  free(vCut);
  return pAVar4;
}

Assistant:

Aig_Man_t * Saig_ManRetimeForwardOne( Aig_Man_t * p, int * pnRegFixed, int * pnRegMoves )
{
    Aig_Man_t * pNew;
    Vec_Ptr_t * vCut;
    Aig_Obj_t * pObj, * pFanin;
    int i;
    // mark the retimable nodes
    Saig_ManMarkAutonomous( p );
    // mark the retimable registers with the fresh trav ID
    Aig_ManIncrementTravId( p );
    *pnRegFixed = 0;
    Saig_ManForEachLo( p, pObj, i )
        if ( Aig_ObjIsTravIdPrevious(p, pObj) )
            Aig_ObjSetTravIdCurrent(p, pObj);
        else
            (*pnRegFixed)++;
    // mark all the nodes that can be retimed forward
    *pnRegMoves = 0;
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(p, Aig_ObjFanin0(pObj)) && Aig_ObjIsTravIdCurrent(p, Aig_ObjFanin1(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, pObj);
            (*pnRegMoves)++;
        }
    // mark the remaining registers
    Saig_ManForEachLo( p, pObj, i )
        Aig_ObjSetTravIdCurrent(p, pObj);
    // find the cut (all such marked objects that fanout into unmarked nodes)
    vCut = Vec_PtrAlloc( 1000 );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsTravIdPrevious(p, pObj) )
            continue;
        pFanin = Aig_ObjFanin0(pObj);
        if ( pFanin && Aig_ObjIsTravIdPrevious(p, pFanin) )
        {
            Vec_PtrPush( vCut, pFanin );
            Aig_ObjSetTravIdCurrent( p, pFanin );
        }
        pFanin = Aig_ObjFanin1(pObj);
        if ( pFanin && Aig_ObjIsTravIdPrevious(p, pFanin) )
        {
            Vec_PtrPush( vCut, pFanin );
            Aig_ObjSetTravIdCurrent( p, pFanin );
        }
    }
    // finally derive the new manager
    pNew = Saig_ManRetimeDupForward( p, vCut );
    Vec_PtrFree( vCut );
    return pNew;
}